

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O2

int kwsysSystem_Shell__ArgumentNeedsQuotes(char *in,int isUnix,int flags)

{
  byte *pbVar1;
  byte bVar2;
  char *c;
  byte *c_00;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  
  bVar2 = *in;
  iVar6 = 1;
  if (bVar2 != 0) {
    bVar4 = 1;
    c_00 = (byte *)in;
    bVar3 = bVar2;
    while (bVar4 != 0) {
      if ((flags & 0x40U) != 0) {
        c_00 = (byte *)kwsysSystem_Shell__SkipMakeVariables((char *)c_00);
        bVar3 = *c_00;
        if (bVar3 == 0) break;
      }
      if ((flags & 4U) == 0 || isUnix != 0) {
        if (bVar3 == 9) {
          return 1;
        }
        if (bVar3 == 0x20) {
          return 1;
        }
        uVar5 = bVar3 - 0x23;
        if (isUnix == 0) {
          if ((uVar5 < 0x3c) && ((0x80000000a000019U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
            return 1;
          }
          if (bVar3 == 0x7c) {
            return 1;
          }
        }
        else {
          if ((uVar5 < 0x3e) && ((0x2a0000000b0000fbU >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
            return 1;
          }
          if (bVar3 == 0x7c) {
            return 1;
          }
          if (bVar3 == 0x7e) {
            return 1;
          }
        }
      }
      pbVar1 = c_00 + 1;
      c_00 = c_00 + 1;
      bVar4 = *pbVar1;
      bVar3 = bVar4;
    }
    if (((isUnix != 0) || (in[1] != '\0')) ||
       (((0x3b < bVar2 - 0x23 || ((0x800000010000009U >> ((ulong)(bVar2 - 0x23) & 0x3f) & 1) == 0))
        && (bVar2 != 0x7c)))) {
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

static int kwsysSystem_Shell__ArgumentNeedsQuotes(const char* in, int isUnix,
                                                  int flags)
{
  /* The empty string needs quotes.  */
  if(!*in)
    {
    return 1;
    }

  /* Scan the string for characters that require quoting.  */
  {
  const char* c;
  for(c=in; *c; ++c)
    {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if(flags & kwsysSystem_Shell_Flag_AllowMakeVariables)
      {
#if KWSYS_SYSTEM_SHELL_QUOTE_MAKE_VARIABLES
      const char* skip = kwsysSystem_Shell__SkipMakeVariables(c);
      if(skip != c)
        {
        /* We need to quote make variable references to preserve the
           string with contents substituted in its place.  */
        return 1;
        }
#else
      /* Skip over the make variable references if any are present.  */
      c = kwsysSystem_Shell__SkipMakeVariables(c);

      /* Stop if we have reached the end of the string.  */
      if(!*c)
        {
        break;
        }
#endif
      }

    /* Check whether this character needs quotes.  */
    if(kwsysSystem_Shell__CharNeedsQuotes(*c, isUnix, flags))
      {
      return 1;
      }
    }
  }

  /* On Windows some single character arguments need quotes.  */
  if(!isUnix && *in && !*(in+1))
    {
    char c = *in;
    if((c == '?') || (c == '&') || (c == '^') || (c == '|') || (c == '#'))
      {
      return 1;
      }
    }

  return 0;
}